

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

RepeatedFieldRef<google::protobuf::Message,_void> * __thiscall
google::protobuf::Reflection::GetRepeatedFieldRef<google::protobuf::Message>
          (RepeatedFieldRef<google::protobuf::Message,_void> *__return_storage_ptr__,
          Reflection *this,Message *message,FieldDescriptor *field)

{
  Nonnull<const_char_*> pcVar1;
  Metadata MVar2;
  
  MVar2 = Message::GetMetadata(message);
  if (MVar2.reflection == this) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (MVar2.reflection,this,"message.GetReflection() == this");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
              (__return_storage_ptr__,message,field);
    return __return_storage_ptr__;
  }
  GetRepeatedFieldRef<google::protobuf::Message>();
}

Assistant:

RepeatedFieldRef<T> Reflection::GetRepeatedFieldRef(
    const Message& message, const FieldDescriptor* field) const {
  ABSL_DCHECK_EQ(message.GetReflection(), this);
  return RepeatedFieldRef<T>(message, field);
}